

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O3

bool __thiscall
Assimp::DefaultLogger::detatchStream(DefaultLogger *this,LogStream *pStream,uint severity)

{
  pointer ppLVar1;
  LogStreamInfo *pLVar2;
  pointer __dest;
  pointer ppLVar3;
  uint uVar4;
  pointer __src;
  
  if (pStream != (LogStream *)0x0) {
    ppLVar3 = (this->m_StreamArray).
              super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar1 = (this->m_StreamArray).
              super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppLVar3 != ppLVar1) {
      uVar4 = ~severity;
      __dest = ppLVar3;
      do {
        __src = __dest + 1;
        pLVar2 = *ppLVar3;
        if (pLVar2->m_pStream == pStream) {
          if (severity == 0) {
            uVar4 = 0xfffffff0;
          }
          pLVar2->m_uiErrorSeverity = pLVar2->m_uiErrorSeverity & uVar4;
          if ((*ppLVar3)->m_uiErrorSeverity != 0) {
            return true;
          }
          (*ppLVar3)->m_pStream = (LogStream *)0x0;
          pLVar2 = *ppLVar3;
          if ((pLVar2 != (LogStreamInfo *)0x0) && (pLVar2->m_pStream != (LogStream *)0x0)) {
            (*pLVar2->m_pStream->_vptr_LogStream[1])();
          }
          operator_delete(pLVar2);
          ppLVar3 = (this->m_StreamArray).
                    super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (__src != ppLVar3) {
            memmove(__dest,__src,(long)ppLVar3 - (long)__src);
            ppLVar3 = (this->m_StreamArray).
                      super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          (this->m_StreamArray).
          super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppLVar3 + -1;
          return true;
        }
        ppLVar3 = ppLVar3 + 1;
        __dest = __src;
      } while (ppLVar3 != ppLVar1);
    }
  }
  return false;
}

Assistant:

bool DefaultLogger::detatchStream( LogStream *pStream, unsigned int severity ) {
    if ( nullptr == pStream ) {
        return false;
    }

    if (0 == severity)  {
        severity = SeverityAll;
    }

    bool res( false );
    for ( StreamIt it = m_StreamArray.begin(); it != m_StreamArray.end(); ++it ) {
        if ( (*it)->m_pStream == pStream ) {
            (*it)->m_uiErrorSeverity &= ~severity;
            if ( (*it)->m_uiErrorSeverity == 0 ) {
                // don't delete the underlying stream 'cause the caller gains ownership again
                (**it).m_pStream = nullptr;
                delete *it;
                m_StreamArray.erase( it );
                res = true;
                break;
            }
            return true;
        }
    }
    return res;
}